

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_roxr_16_pi(void)

{
  uint uVar1;
  uint uVar2;
  uint addr_in;
  uint uVar3;
  
  addr_in = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] = addr_in + 2;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar1 = addr_in;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar1 = pmmu_translate_addr(addr_in);
  }
  uVar2 = m68k_read_memory_16(uVar1 & m68ki_cpu.address_mask);
  uVar3 = (m68ki_cpu.x_flag & 0x100) << 8;
  m68ki_cpu.x_flag = (uVar2 << 0x10 | (uVar3 | uVar2) >> 1) >> 8;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  uVar3 = uVar3 | uVar2 & 0x1fffe;
  uVar2 = uVar3 >> 1;
  m68k_write_memory_16(addr_in & m68ki_cpu.address_mask,uVar2);
  m68ki_cpu.n_flag = uVar3 >> 9;
  m68ki_cpu.not_z_flag = uVar2;
  m68ki_cpu.v_flag = 0;
  return;
}

Assistant:

static void m68k_op_roxr_16_pi(void)
{
	uint ea = EA_AY_PI_16();
	uint src = m68ki_read_16(ea);
	uint res = ROR_17(src | (XFLAG_AS_1() << 16), 1);

	FLAG_C = FLAG_X = res >> 8;
	res = MASK_OUT_ABOVE_16(res);

	m68ki_write_16(ea, res);

	FLAG_N = NFLAG_16(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
}